

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O0

SnapshotImpl * __thiscall
leveldb::SnapshotList::New(SnapshotList *this,SequenceNumber sequence_number)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  SnapshotImpl *pSVar4;
  ulong in_RSI;
  SnapshotImpl *in_RDI;
  long in_FS_OFFSET;
  SnapshotImpl *snapshot;
  SnapshotList *in_stack_ffffffffffffffa8;
  SequenceNumber in_stack_ffffffffffffffb0;
  SnapshotImpl *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = empty(in_stack_ffffffffffffffa8);
  bVar2 = true;
  if (!bVar3) {
    pSVar4 = newest((SnapshotList *)in_stack_ffffffffffffffb8);
    bVar2 = pSVar4->sequence_number_ <= in_RSI;
  }
  if (!bVar2) {
    __assert_fail("empty() || newest()->sequence_number_ <= sequence_number",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/snapshot.h"
                  ,0x3a,"SnapshotImpl *leveldb::SnapshotList::New(SequenceNumber)");
  }
  pSVar4 = (SnapshotImpl *)operator_new(0x28);
  SnapshotImpl::SnapshotImpl(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  pSVar4->list_ = (SnapshotList *)in_RDI;
  pSVar4->next_ = in_RDI;
  pSVar4->prev_ = in_RDI->prev_;
  pSVar4->prev_->next_ = pSVar4;
  pSVar4->next_->prev_ = pSVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar4;
  }
  __stack_chk_fail();
}

Assistant:

SnapshotImpl* New(SequenceNumber sequence_number) {
    assert(empty() || newest()->sequence_number_ <= sequence_number);

    SnapshotImpl* snapshot = new SnapshotImpl(sequence_number);

#if !defined(NDEBUG)
    snapshot->list_ = this;
#endif  // !defined(NDEBUG)
    snapshot->next_ = &head_;
    snapshot->prev_ = head_.prev_;
    snapshot->prev_->next_ = snapshot;
    snapshot->next_->prev_ = snapshot;
    return snapshot;
  }